

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

bool sqlcheck::IsDDLStatement(string *sql_statement)

{
  long lVar1;
  bool bVar2;
  string alter_table_template;
  string create_table_template;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"create table","");
  lVar1 = std::__cxx11::string::find((char *)sql_statement,(ulong)local_40[0],0);
  bVar2 = true;
  if (lVar1 == -1) {
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"alter table","");
    lVar1 = std::__cxx11::string::find((char *)sql_statement,(ulong)local_60[0],0);
    bVar2 = lVar1 != -1;
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return bVar2;
}

Assistant:

bool IsDDLStatement(const std::string& sql_statement){
  std::string create_table_template = "create table";
  std::size_t found = sql_statement.find(create_table_template);
  if (found != std::string::npos) {
    return true;
  }

  std::string alter_table_template = "alter table";
  found = sql_statement.find(alter_table_template);
  if (found != std::string::npos) {
    return true;
  }

  return false;
}